

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint nbBits;
  uint uVar5;
  size_t code;
  int iVar6;
  uint local_178;
  uint local_16c;
  BYTE *ofCodeTable_local;
  FSE_CTable *CTable_OffsetBits_local;
  BYTE *mlCodeTable_local;
  FSE_CTable *CTable_MatchLength_local;
  size_t dstCapacity_local;
  void *dst_local;
  size_t streamSize;
  int extraBits_1;
  U32 mlBits;
  U32 ofBits_1;
  U32 llBits;
  BYTE mlCode;
  BYTE ofCode;
  BYTE llCode;
  size_t n;
  int extraBits;
  U32 ofBits;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  BIT_CStream_t blockStream;
  size_t local_20;
  
  code = BIT_initCStream((BIT_CStream_t *)&stateMatchLength.stateLog,dst,dstCapacity);
  uVar3 = ERR_isError(code);
  if (uVar3 == 0) {
    FSE_initCState2((FSE_CState_t *)&stateOffsetBits.stateLog,CTable_MatchLength,
                    (uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2((FSE_CState_t *)&stateLitLength.stateLog,CTable_OffsetBits,
                    (uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2((FSE_CState_t *)&extraBits,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[nbSeq - 1].litLength,
                LL_bits[llCodeTable[nbSeq - 1]]);
    uVar3 = MEM_32bits();
    if (uVar3 != 0) {
      BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
    }
    BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[nbSeq - 1].matchLength,
                ML_bits[mlCodeTable[nbSeq - 1]]);
    uVar3 = MEM_32bits();
    if (uVar3 != 0) {
      BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
    }
    if (longOffsets == 0) {
      BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[nbSeq - 1].offset,
                  (uint)ofCodeTable[nbSeq - 1]);
    }
    else {
      uVar3 = (uint)ofCodeTable[nbSeq - 1];
      uVar4 = MEM_32bits();
      iVar6 = 0x39;
      if (uVar4 != 0) {
        iVar6 = 0x19;
      }
      local_16c = uVar3;
      if (iVar6 - 1U <= uVar3) {
        uVar4 = MEM_32bits();
        iVar6 = 0x39;
        if (uVar4 != 0) {
          iVar6 = 0x19;
        }
        local_16c = iVar6 - 1;
      }
      local_16c = uVar3 - local_16c;
      if (local_16c != 0) {
        BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[nbSeq - 1].offset,
                    local_16c);
        BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
      }
      BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,
                  (ulong)(sequences[nbSeq - 1].offset >> ((byte)local_16c & 0x1f)),uVar3 - local_16c
                 );
    }
    BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
    for (_llBits = nbSeq - 2; _llBits < nbSeq; _llBits = _llBits - 1) {
      bVar1 = llCodeTable[_llBits];
      bVar2 = mlCodeTable[_llBits];
      uVar3 = LL_bits[bVar1];
      nbBits = (uint)ofCodeTable[_llBits];
      uVar4 = ML_bits[bVar2];
      FSE_encodeSymbol((BIT_CStream_t *)&stateMatchLength.stateLog,
                       (FSE_CState_t *)&stateLitLength.stateLog,(uint)ofCodeTable[_llBits]);
      FSE_encodeSymbol((BIT_CStream_t *)&stateMatchLength.stateLog,
                       (FSE_CState_t *)&stateOffsetBits.stateLog,(uint)bVar2);
      uVar5 = MEM_32bits();
      if (uVar5 != 0) {
        BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
      }
      FSE_encodeSymbol((BIT_CStream_t *)&stateMatchLength.stateLog,(FSE_CState_t *)&extraBits,
                       (uint)bVar1);
      uVar5 = MEM_32bits();
      if ((uVar5 != 0) || (0x1e < nbBits + uVar4 + uVar3)) {
        BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
      }
      BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[_llBits].litLength,
                  uVar3);
      uVar5 = MEM_32bits();
      if ((uVar5 != 0) && (0x18 < uVar3 + uVar4)) {
        BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
      }
      BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[_llBits].matchLength,
                  uVar4);
      uVar5 = MEM_32bits();
      if ((uVar5 != 0) || (0x38 < nbBits + uVar4 + uVar3)) {
        BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
      }
      if (longOffsets == 0) {
        BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[_llBits].offset,
                    nbBits);
      }
      else {
        uVar3 = MEM_32bits();
        iVar6 = 0x39;
        if (uVar3 != 0) {
          iVar6 = 0x19;
        }
        local_178 = nbBits;
        if (iVar6 - 1U <= nbBits) {
          uVar3 = MEM_32bits();
          iVar6 = 0x39;
          if (uVar3 != 0) {
            iVar6 = 0x19;
          }
          local_178 = iVar6 - 1;
        }
        local_178 = nbBits - local_178;
        if (local_178 != 0) {
          BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,(ulong)sequences[_llBits].offset,
                      local_178);
          BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
        }
        BIT_addBits((BIT_CStream_t *)&stateMatchLength.stateLog,
                    (ulong)(sequences[_llBits].offset >> ((byte)local_178 & 0x1f)),
                    nbBits - local_178);
      }
      BIT_flushBits((BIT_CStream_t *)&stateMatchLength.stateLog);
    }
    FSE_flushCState((BIT_CStream_t *)&stateMatchLength.stateLog,
                    (FSE_CState_t *)&stateOffsetBits.stateLog);
    FSE_flushCState((BIT_CStream_t *)&stateMatchLength.stateLog,
                    (FSE_CState_t *)&stateLitLength.stateLog);
    FSE_flushCState((BIT_CStream_t *)&stateMatchLength.stateLog,(FSE_CState_t *)&extraBits);
    local_20 = BIT_closeCStream((BIT_CStream_t *)&stateMatchLength.stateLog);
    if (local_20 == 0) {
      local_20 = 0xffffffffffffffba;
    }
  }
  else {
    local_20 = 0xffffffffffffffba;
  }
  return local_20;
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}